

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

quad<unsigned_char> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
::encode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
           *this,quad<unsigned_char> x,quad<unsigned_char> ra,quad<unsigned_char> rb)

{
  default_traits<unsigned_char,_charls::quad<unsigned_char>_> *this_00;
  array<charls::context_run_mode,_2UL> *context;
  int iVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int32_t error_value;
  int32_t error_value_00;
  uint uVar9;
  int32_t error_value_01;
  uint uVar10;
  int32_t error_value_02;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  
  uVar2 = (uint)rb >> 0x18;
  uVar11 = (uint)rb & 0xff;
  uVar7 = -(uint)(uVar11 < ((uint)ra & 0xff)) | 1;
  iVar14 = (((uint)x & 0xff) - uVar11) * uVar7;
  iVar1 = (this->traits_).near_lossless;
  iVar8 = -iVar1;
  if (0 < iVar14) {
    iVar8 = iVar1;
  }
  this_00 = &this->traits_;
  error_value = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::modulo_range
                          (this_00,(iVar8 + iVar14) / (iVar1 * 2 + 1));
  context = &this->context_run_mode_;
  encode_run_interruption_error(this,context->_M_elems,error_value);
  uVar12 = (uint)rb >> 8 & 0xff;
  uVar15 = -(uint)(uVar12 < ((uint)ra >> 8 & 0xff)) | 1;
  iVar14 = (((uint)x >> 8 & 0xff) - uVar12) * uVar15;
  iVar1 = (this->traits_).near_lossless;
  iVar8 = -iVar1;
  if (0 < iVar14) {
    iVar8 = iVar1;
  }
  error_value_00 =
       default_traits<unsigned_char,_charls::quad<unsigned_char>_>::modulo_range
                 (this_00,(iVar8 + iVar14) / (iVar1 * 2 + 1));
  encode_run_interruption_error(this,context->_M_elems,error_value_00);
  uVar9 = (uint)rb >> 0x10 & 0xff;
  uVar13 = -(uint)(uVar9 < ((uint)ra >> 0x10 & 0xff)) | 1;
  iVar14 = (((uint)x >> 0x10 & 0xff) - uVar9) * uVar13;
  iVar1 = (this->traits_).near_lossless;
  iVar8 = -iVar1;
  if (0 < iVar14) {
    iVar8 = iVar1;
  }
  error_value_01 =
       default_traits<unsigned_char,_charls::quad<unsigned_char>_>::modulo_range
                 (this_00,(iVar8 + iVar14) / (iVar1 * 2 + 1));
  encode_run_interruption_error(this,context->_M_elems,error_value_01);
  uVar10 = -(uint)(uVar2 < (uint)ra >> 0x18) | 1;
  iVar14 = (((uint)x >> 0x18) - uVar2) * uVar10;
  iVar1 = (this->traits_).near_lossless;
  iVar8 = -iVar1;
  if (0 < iVar14) {
    iVar8 = iVar1;
  }
  error_value_02 =
       default_traits<unsigned_char,_charls::quad<unsigned_char>_>::modulo_range
                 (this_00,(iVar8 + iVar14) / (iVar1 * 2 + 1));
  encode_run_interruption_error(this,context->_M_elems,error_value_02);
  bVar3 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * uVar7 * error_value + uVar11)
  ;
  bVar4 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * uVar15 * error_value_00 +
                             uVar12);
  bVar5 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * uVar13 * error_value_01 +
                             uVar9);
  bVar6 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * uVar10 * error_value_02 +
                             uVar2);
  return (quad<unsigned_char>)
         ((uint)bVar6 << 0x18 | (uint)bVar3 | (uint)bVar4 << 8 | (uint)bVar5 << 0x10);
}

Assistant:

quad<sample_type> encode_run_interruption_pixel(const quad<sample_type> x, const quad<sample_type> ra,
                                                    const quad<sample_type> rb)
    {
        const int32_t error_value1{traits_.compute_error_value(sign(rb.v1 - ra.v1) * (x.v1 - rb.v1))};
        encode_run_interruption_error(context_run_mode_[0], error_value1);

        const int32_t error_value2{traits_.compute_error_value(sign(rb.v2 - ra.v2) * (x.v2 - rb.v2))};
        encode_run_interruption_error(context_run_mode_[0], error_value2);

        const int32_t error_value3{traits_.compute_error_value(sign(rb.v3 - ra.v3) * (x.v3 - rb.v3))};
        encode_run_interruption_error(context_run_mode_[0], error_value3);

        const int32_t error_value4{traits_.compute_error_value(sign(rb.v4 - ra.v4) * (x.v4 - rb.v4))};
        encode_run_interruption_error(context_run_mode_[0], error_value4);

        return quad<sample_type>(
            triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                 traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                 traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3))),
            traits_.compute_reconstructed_sample(rb.v4, error_value4 * sign(rb.v4 - ra.v4)));
    }